

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerTypes.cpp
# Opt level: O3

bool __thiscall Boolean::Decode(Boolean *this,uchar *pIn,size_t cbIn,size_t *cbUsed)

{
  uchar uVar1;
  bool bVar2;
  out_of_range *this_00;
  undefined8 *puVar3;
  size_t sVar4;
  size_t local_38;
  size_t size;
  
  local_38 = 0;
  size = 0;
  if (cbIn < 3) {
    if (cbIn != 2) goto LAB_00139666;
    if (pIn[1] != '\0') {
      uVar1 = *pIn;
      goto LAB_0013965b;
    }
    local_38 = 2;
    size = 2;
  }
  else {
    uVar1 = *pIn;
    if (-1 < (char)uVar1 && uVar1 != '\x01') {
LAB_0013965b:
      if ((uVar1 == '\x05') && (pIn[1] == '\0')) {
        bVar2 = true;
        sVar4 = 2;
        goto LAB_0013969e;
      }
LAB_00139666:
      sVar4 = 0;
      bVar2 = false;
      goto LAB_0013969e;
    }
    bVar2 = DecodeSize(pIn + 1,cbIn - 1,&local_38,&size);
    if (!bVar2) {
LAB_001396b7:
      this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
      std::out_of_range::out_of_range(this_00,"Illegal size value");
      __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
    }
    if (cbIn < size + local_38 + 1) goto LAB_001396b7;
    size = size + 1;
  }
  if (local_38 + size != 3) {
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar3 = std::__throw_bad_cast;
    __cxa_throw(puVar3,&std::exception::typeinfo,std::exception::~exception);
  }
  this->b = -(pIn[2] != '\0');
  bVar2 = true;
  sVar4 = 3;
LAB_0013969e:
  *cbUsed = sVar4;
  return bVar2;
}

Assistant:

bool Boolean::Decode(const unsigned char * pIn, size_t cbIn, size_t & cbUsed)
{
	size_t size = 0;
	size_t cbPrefix = 0;
	if (!CheckDecode(pIn, cbIn, DerType::Boolean, size, cbPrefix))
	{
		return DecodeNull(pIn, cbIn, cbUsed);
	}

	// Now check specifics for this type
	if (cbPrefix + size != 3)
		throw std::exception(); // Incorrect decode

	b = pIn[2] ? 0xff : 0;
	cbUsed = 3;
	return true;
}